

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_helper.cpp
# Opt level: O1

bool duckdb::KeywordHelper::RequiresQuotes(string *text,bool allow_caps)

{
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  PGKeywordCategory type;
  KeywordCategory KVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar2 = text->_M_string_length;
  bVar6 = uVar2 != 0;
  if (bVar6) {
    pcVar3 = (text->_M_dataplus)._M_p;
    uVar5 = 1;
    do {
      if ((((uVar5 == 1) || (9 < (byte)(pcVar3[uVar5 - 1] - 0x30U))) &&
          (cVar1 = pcVar3[uVar5 - 1], 0x19 < (byte)(cVar1 + 0x9fU))) &&
         ((cVar1 != '_' && (0x19 < (byte)(cVar1 + 0xbfU) || !allow_caps)))) {
        if (bVar6) {
          return true;
        }
        break;
      }
      bVar6 = uVar5 < uVar2;
      bVar7 = uVar5 != uVar2;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  type = PostgresParser::IsKeyword(text);
  KVar4 = ToKeywordCategory(type);
  return KVar4 != KEYWORD_NONE;
}

Assistant:

bool KeywordHelper::RequiresQuotes(const string &text, bool allow_caps) {
	for (size_t i = 0; i < text.size(); i++) {
		if (i > 0 && (text[i] >= '0' && text[i] <= '9')) {
			continue;
		}
		if (text[i] >= 'a' && text[i] <= 'z') {
			continue;
		}
		if (allow_caps) {
			if (text[i] >= 'A' && text[i] <= 'Z') {
				continue;
			}
		}
		if (text[i] == '_') {
			continue;
		}
		return true;
	}
	return IsKeyword(text);
}